

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_nonlin.c
# Opt level: O2

int main(void)

{
  int iVar1;
  long *flagvalue;
  void *flagvalue_00;
  FILE *pFVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  int flag;
  sunrealtype t;
  double local_48;
  SUNContext ctx;
  void *local_38;
  
  flag = SUNContext_Create(0,&ctx);
  iVar3 = 1;
  iVar1 = check_flag(&flag,"SUNContext_Create",1);
  if (iVar1 == 0) {
    puts("\nAnalytical ODE test problem:");
    printf("   reltol = %.1e\n",0x3eb0c6f7a0b5ed8d);
    printf("   abstol = %.1e\n\n",0x3ddb7cdfd9d7bdbb);
    flagvalue = (long *)N_VNew_Serial(1,ctx);
    iVar1 = check_flag(flagvalue,"N_VNew_Serial",0);
    if (iVar1 == 0) {
      **(undefined8 **)(*flagvalue + 0x10) = 0;
      flagvalue_00 = (void *)ERKStepCreate(0,f,flagvalue,ctx);
      local_38 = flagvalue_00;
      iVar1 = check_flag(flagvalue_00,"ERKStepCreate",0);
      if (iVar1 == 0) {
        flag = ARKodeSStolerances(0x3eb0c6f7a0b5ed8d,0x3ddb7cdfd9d7bdbb,flagvalue_00);
        iVar3 = 1;
        iVar1 = check_flag(&flag,"ARKodeSStolerances",1);
        if (iVar1 == 0) {
          pFVar2 = fopen("solution.txt","w");
          fwrite("# t u\n",6,1,pFVar2);
          fprintf(pFVar2," %.16e %.16e\n",0,**(undefined8 **)(*flagvalue + 0x10));
          t = 0.0;
          puts("        t           u");
          puts("   ---------------------");
          local_48 = 1.0;
          dVar4 = 0.0;
          while (1e-15 < 10.0 - dVar4) {
            flag = ARKodeEvolve(local_48,flagvalue_00,flagvalue,&t,1);
            iVar1 = check_flag(&flag,"ARKodeEvolve",1);
            if (iVar1 != 0) break;
            printf("  %10.6f  %10.6f\n",t,**(undefined8 **)(*flagvalue + 0x10));
            fprintf(pFVar2," %.16e %.16e\n",t,**(undefined8 **)(*flagvalue + 0x10));
            if (flag < 0) {
              fwrite("Solver failure, stopping integration\n",0x25,1,_stderr);
              break;
            }
            dVar5 = local_48 + 1.0;
            local_48 = 10.0;
            dVar4 = t;
            if (dVar5 <= 10.0) {
              local_48 = dVar5;
            }
          }
          puts("   ---------------------");
          fclose(pFVar2);
          puts("\nFinal Statistics:");
          iVar3 = 0;
          flag = ARKodePrintAllStats(flagvalue_00,_stdout,0);
          pFVar2 = fopen("ark_analytic_nonlin_stats.csv","w");
          flag = ARKodePrintAllStats(flagvalue_00,pFVar2,1);
          fclose(pFVar2);
          N_VDestroy(flagvalue);
          ARKodeFree(&local_38);
          SUNContext_Free(&ctx);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);  /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0); /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);  /* time between outputs */
  sunindextype NEQ   = 1;                /* number of dependent vars. */
  sunrealtype reltol = 1.0e-6;           /* tolerances */
  sunrealtype abstol = 1.0e-10;

  /* general problem variables */
  int flag;                /* reusable error-checking flag */
  N_Vector y       = NULL; /* empty vector for storing solution */
  void* arkode_mem = NULL; /* empty ARKode memory structure */
  FILE *UFID, *FID;
  sunrealtype t, tout;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initial problem output */
  printf("\nAnalytical ODE test problem:\n");
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = 0.0; /* Specify initial condition */

  /* Call ERKStepCreate to initialize the ERK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y. */
  arkode_mem = ERKStepCreate(f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ERKStepCreate", 0)) { return 1; }

  /* Specify tolerances */
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol);
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM "\n", T0, NV_Ith_S(y, 0));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u\n");
  printf("   ---------------------\n");
  while (Tf - t > 1.0e-15)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0)); /* access/print solution */
    fprintf(UFID, " %.16" ESYM " %.16" ESYM "\n", t, NV_Ith_S(y, 0));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ---------------------\n");
  fclose(UFID);

  /* Print final statistics */
  printf("\nFinal Statistics:\n");
  flag = ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID  = fopen("ark_analytic_nonlin_stats.csv", "w");
  flag = ARKodePrintAllStats(arkode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Clean up and return with successful completion */
  N_VDestroy(y);           /* Free y vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}